

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O1

void snap_handle_reader_ops(SnapHandlePool *shp)

{
  fdb_iterator *iterator_00;
  fdb_status fVar1;
  int iVar2;
  fdb_kvs_handle *handle;
  ts_nsec tVar3;
  ts_nsec tVar4;
  uint64_t uVar5;
  size_t seek_keylen;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  char keybuf [256];
  fdb_iterator *local_148;
  fdb_doc *local_140;
  char local_138 [264];
  
  handle = SnapHandlePool::getCloneOfASnapHandle(shp);
  if (handle != (fdb_kvs_handle *)0x0) {
    local_148 = (fdb_iterator *)0x0;
    local_140 = (fdb_doc *)0x0;
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_init(handle,&local_148,(void *)0x0,0,(void *)0x0,0,0);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x203,(long)fVar1,0);
    }
    uVar5 = ts_diff(tVar3,tVar4);
    FileHandlePool::collectStat(&shp->super_FileHandlePool,5,uVar5);
    iVar2 = rand();
    sprintf(local_138,"key%d",(ulong)(uint)(iVar2 % 100));
    tVar3 = get_monotonic_ts();
    iterator_00 = local_148;
    seek_keylen = strlen(local_138);
    fVar1 = fdb_iterator_seek(iterator_00,local_138,seek_keylen,'\0');
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) {
      if (fVar1 == FDB_RESULT_SUCCESS) {
        uVar5 = ts_diff(tVar3,tVar4);
        FileHandlePool::collectStat(&shp->super_FileHandlePool,6,uVar5);
      }
      else {
        fdb_assert_die("status == FDB_RESULT_ITERATOR_FAIL",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x215,(long)fVar1,0xfffffffffffffff4);
      }
    }
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_get(local_148,&local_140);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) {
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_doc_free(local_140);
        uVar5 = ts_diff(tVar3,tVar4);
        FileHandlePool::collectStat(&shp->super_FileHandlePool,7,uVar5);
      }
      else {
        fdb_assert_die("status == FDB_RESULT_ITERATOR_FAIL",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                       ,0x221,(long)fVar1,0xfffffffffffffff4);
      }
    }
    tVar3 = get_monotonic_ts();
    fVar1 = fdb_iterator_close(local_148);
    tVar4 = get_monotonic_ts();
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x228,(long)fVar1,0);
    }
    uVar5 = ts_diff(tVar3,tVar4);
    FileHandlePool::collectStat(&shp->super_FileHandlePool,8,uVar5);
    fVar1 = fdb_kvs_close(handle);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fdb_assert_die("status == FDB_RESULT_SUCCESS",
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                     ,0x22e,(long)fVar1,0);
    }
  }
  return;
}

Assistant:

void snap_handle_reader_ops(SnapHandlePool *shp) {
    fdb_status status;
    fdb_kvs_handle *snapClone = shp->getCloneOfASnapHandle();
    if (!snapClone) {
        // No snapshot handle available yet
        return;
    }

    fdb_iterator *iterator = nullptr;
    fdb_doc *rdoc = nullptr;
    ts_nsec begin, end;

    // Initialize iterator
    begin = get_monotonic_ts();
    status = fdb_iterator_init(snapClone, &iterator,
                               nullptr, 0, nullptr, 0,
                               FDB_ITR_NONE);
    end = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    shp->collectStat(ITR_INIT, ts_diff(begin, end));

    // Seek random key with iterator
    char keybuf[256];
    int i = rand() % 100;
    sprintf(keybuf, "key%d", i);
    begin = get_monotonic_ts();
    status = fdb_iterator_seek(iterator,
                               (void*)keybuf, strlen(keybuf),
                               FDB_ITR_SEEK_HIGHER);
    end = get_monotonic_ts();
    if (status == FDB_RESULT_SUCCESS) {
        shp->collectStat(ITR_SEEK, ts_diff(begin, end));
    } else {
        // Block not found, no keys available
        fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                   status, FDB_RESULT_ITERATOR_FAIL);
    }

    // Get using iterator
    begin = get_monotonic_ts();
    status = fdb_iterator_get(iterator, &rdoc);
    end = get_monotonic_ts();
    if (status == FDB_RESULT_SUCCESS) {
        fdb_doc_free(rdoc);
        shp->collectStat(ITR_GET, ts_diff(begin, end));
    } else {
        fdb_assert(status == FDB_RESULT_ITERATOR_FAIL,
                   status, FDB_RESULT_ITERATOR_FAIL);
    }

    // Close iterator
    begin = get_monotonic_ts();
    status = fdb_iterator_close(iterator);
    end = get_monotonic_ts();
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);

    shp->collectStat(ITR_CLOSE, ts_diff(begin, end));

    // Close snapshot clone
    status = fdb_kvs_close(snapClone);
    fdb_assert(status == FDB_RESULT_SUCCESS, status, FDB_RESULT_SUCCESS);
}